

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall helics::apps::Connector::runTo(Connector *this,Time stopTime_input)

{
  Modes MVar1;
  element_type *peVar2;
  long *in_RDI;
  Modes cmode;
  IterationRequest in_stack_00000067;
  Federate *in_stack_00000068;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x26c091);
  MVar1 = Federate::getCurrentMode((Federate *)0x26c0a0);
  if (MVar1 == STARTUP) {
    (**(code **)(*in_RDI + 0x10))();
  }
  if ((char)MVar1 < '\x02') {
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26c0cb);
    Federate::enterExecutingMode(in_stack_00000068,in_stack_00000067);
  }
  else {
    peVar2 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26c0ec);
    (*(peVar2->super_ValueFederate)._vptr_ValueFederate[4])();
  }
  return;
}

Assistant:

void Connector::runTo([[maybe_unused]] Time stopTime_input)
{
    auto cmode = fed->getCurrentMode();
    if (cmode == Federate::Modes::STARTUP) {
        initialize();
    }
    if (cmode < Federate::Modes::EXECUTING) {
        fed->enterExecutingMode();
    } else {
        fed->disconnect();
    }
}